

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O1

int Lpk_NodeCuts(Lpk_Man_t *p)

{
  uint uVar1;
  Vec_Ptr_t *vNodes;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  int *piVar8;
  long lVar9;
  Lpk_Cut_t *pCut;
  Lpk_Cut_t *pCut_00;
  float fVar10;
  
  vNodes = p->vTemp;
  vNodes->nSize = 0;
  iVar3 = Abc_NodeMffcLabel(p->pObj,vNodes);
  p->nMffc = iVar3;
  if (iVar3 < 1) {
    __assert_fail("nMffc > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkCut.c"
                  ,0x274,"int Lpk_NodeCuts(Lpk_Man_t *)");
  }
  iVar4 = 0;
  if (iVar3 != 1) {
    pCut_00 = p->pCuts;
    p->nCuts = 1;
    *(uint *)p->pCuts = (*(uint *)p->pCuts & 0xfffc0000) + 1;
    p->pCuts[0].pLeaves[0] = p->pObj->Id;
    Lpk_NodeCutSignature(pCut_00);
    if (0 < p->nCuts) {
      piVar8 = p->pCuts[0].pLeaves;
      lVar9 = 0;
      do {
        if ((undefined1  [820])((undefined1  [820])pCut_00[lVar9] & (undefined1  [820])0x3f) !=
            (undefined1  [820])0x0) {
          pCut = pCut_00 + lVar9;
          if ((undefined1  [820])((undefined1  [820])*pCut & (undefined1  [820])0x3f) !=
              (undefined1  [820])0x0) {
            uVar5 = 0;
            do {
              Lpk_NodeCutsOne(p,pCut,piVar8[uVar5]);
              if (p->nCuts == 10000) break;
              uVar5 = uVar5 + 1;
            } while (uVar5 < (*(uint *)pCut & 0x3f));
          }
          if (p->nCuts == 10000) break;
        }
        lVar9 = lVar9 + 1;
        piVar8 = piVar8 + 0xcd;
      } while (lVar9 < p->nCuts);
    }
    if (p->nCuts == 10000) {
      p->nNodesOver = p->nNodesOver + 1;
    }
    iVar4 = 0;
    if (p->pPars->fSatur != 0) {
      Lpk_NodeRecordImpact(p);
    }
    p->nEvals = 0;
    if (0 < p->nCuts) {
      lVar9 = 0;
      do {
        uVar1 = *(uint *)pCut_00;
        if (1 < (uVar1 & 0x3f)) {
          iVar3 = (uVar1 & 0x3f) - 1;
          iVar6 = p->pPars->nLutSize + -1;
          uVar7 = (uint)(0 < iVar3 % iVar6) + iVar3 / iVar6 & 0x3f;
          *(uint *)pCut_00 = uVar1 & 0xff03ffff | uVar7 << 0x12;
          fVar10 = (float)(int)((uVar1 >> 6 & 0x3f) - (uVar1 >> 0xc & 0x3f)) / (float)uVar7;
          pCut_00->Weight = fVar10;
          if (1.001 < fVar10) {
            iVar3 = Lpk_NodeCutsCheckDsd(p,pCut_00);
            *(uint *)pCut_00 = *(uint *)pCut_00 & 0xbfffffff | iVar3 << 0x1e;
            if (iVar3 == 0) {
              iVar3 = p->nEvals;
              p->nEvals = iVar3 + 1;
              p->pEvals[iVar3] = (int)lVar9;
            }
          }
        }
        lVar9 = lVar9 + 1;
        pCut_00 = pCut_00 + 1;
      } while (lVar9 < p->nCuts);
    }
    iVar3 = p->nEvals;
    if ((iVar3 != 0) && (iVar4 = 1, 1 < iVar3)) {
      do {
        uVar5 = 0;
        bVar2 = false;
        do {
          iVar6 = p->pEvals[uVar5];
          if (p->pCuts[iVar6].Weight < p->pCuts[p->pEvals[uVar5 + 1]].Weight + -0.001) {
            p->pEvals[uVar5] = p->pEvals[uVar5 + 1];
            p->pEvals[uVar5 + 1] = iVar6;
            bVar2 = true;
          }
          uVar5 = uVar5 + 1;
        } while (iVar3 - 1 != uVar5);
      } while ((bVar2) && (1 < iVar3));
    }
  }
  return iVar4;
}

Assistant:

int Lpk_NodeCuts( Lpk_Man_t * p )
{
    Lpk_Cut_t * pCut, * pCut2;
    int i, k, Temp, nMffc, fChanges;
    //int nSupp;

    // mark the MFFC of the node with the current trav ID
    Vec_PtrClear( p->vTemp );
    nMffc = p->nMffc = Abc_NodeMffcLabel( p->pObj, p->vTemp );
    assert( nMffc > 0 );
    if ( nMffc == 1 )
        return 0;
/*
    // count the leaves
    nSupp = Lpk_CountSupp( p->pNtk, p->vTemp );
    if ( nMffc > 10 && nSupp <= 10 )
        printf( "Obj = %4d : Supp = %4d. Mffc = %4d.\n", p->pObj->Id, nSupp, nMffc );
*/
    // initialize the first cut
    pCut = p->pCuts; p->nCuts = 1;
    pCut->nNodes = 0; 
    pCut->nNodesDup = 0;
    pCut->nLeaves = 1;
    pCut->pLeaves[0] = p->pObj->Id;
    // assign the signature
    Lpk_NodeCutSignature( pCut );

    // perform the cut computation
    for ( i = 0; i < p->nCuts; i++ )
    {
        pCut = p->pCuts + i;
        if ( pCut->nLeaves == 0 )
            continue;

        // try to expand the fanins of this cut
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
        {
            // create a new cut
            Lpk_NodeCutsOne( p, pCut, pCut->pLeaves[k] );
            // quit if the number of cuts has exceeded the limit
            if ( p->nCuts == LPK_CUTS_MAX )
                break;
        }
        if ( p->nCuts == LPK_CUTS_MAX )
            break;
    }
    if ( p->nCuts == LPK_CUTS_MAX ) 
        p->nNodesOver++;

    // record the impact of this node
    if ( p->pPars->fSatur )
        Lpk_NodeRecordImpact( p );

    // compress the cuts by removing empty ones, those with negative Weight, and decomposable ones
    p->nEvals = 0;
    for ( i = 0; i < p->nCuts; i++ )
    {
        pCut = p->pCuts + i;
        if ( pCut->nLeaves < 2 )
            continue;
        // compute the minimum number of LUTs needed to implement this cut
        // V = N * (K-1) + 1  ~~~~~  N = Ceiling[(V-1)/(K-1)] = (V-1)/(K-1) + [(V-1)%(K-1) > 0]
        pCut->nLuts = Lpk_LutNumLuts( pCut->nLeaves, p->pPars->nLutSize ); 
//        pCut->Weight = (float)1.0 * (pCut->nNodes - pCut->nNodesDup - 1) / pCut->nLuts; //p->pPars->nLutsMax;
        pCut->Weight = (float)1.0 * (pCut->nNodes - pCut->nNodesDup) / pCut->nLuts; //p->pPars->nLutsMax;
        if ( pCut->Weight <= 1.001 )
//        if ( pCut->Weight <= 0.999 )
            continue;
        pCut->fHasDsd = Lpk_NodeCutsCheckDsd( p, pCut );
        if ( pCut->fHasDsd )
            continue;
        p->pEvals[p->nEvals++] = i;

//        if ( pCut->nLeaves <= 9 && pCut->nNodes > 15 )
//        printf( "%5d : Obj = %4d  Leaves = %4d  Nodes = %4d  LUTs = %4d\n", i, p->pObj->Id, pCut->nLeaves, pCut->nNodes, pCut->nLuts );
    }
    if ( p->nEvals == 0 )
        return 0;

    // sort the cuts by Weight
    do {
        fChanges = 0;
        for ( i = 0; i < p->nEvals - 1; i++ )
        {
            pCut = p->pCuts + p->pEvals[i];
            pCut2 = p->pCuts + p->pEvals[i+1];
            if ( pCut->Weight >= pCut2->Weight - 0.001 )
                continue;
            Temp = p->pEvals[i];
            p->pEvals[i] = p->pEvals[i+1];
            p->pEvals[i+1] = Temp;
            fChanges = 1;
        }
    } while ( fChanges );
/*
    for ( i = 0; i < p->nEvals; i++ )
    {
        pCut = p->pCuts + p->pEvals[i];
        printf( "Cut %3d : W = %5.2f.\n", i, pCut->Weight );
    }
    printf( "\n" );
*/
    return 1;
}